

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

size_t countSizeRequiredForString(size_t stringSize,uint8_t *string)

{
  ulong uStack_28;
  uint8_t c;
  size_t i;
  size_t result;
  uint8_t *string_local;
  size_t stringSize_local;
  
  i = 0;
  for (uStack_28 = 0; uStack_28 < stringSize; uStack_28 = uStack_28 + 1) {
    if (string[uStack_28] == '\\') {
      uStack_28 = uStack_28 + 1;
    }
    i = i + 1;
  }
  return i;
}

Assistant:

static size_t countSizeRequiredForString(size_t stringSize, const uint8_t *string)
{
    size_t result = 0;
    for(size_t i = 0; i < stringSize; ++i)
    {
        uint8_t c = string[i];
        if(c == '\\')
            ++i;
        ++result;
    }

    return result;
}